

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Frames(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint nFanMax;
  uint uVar4;
  Gia_Man_t *pGVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  Gia_ParFra_t Pars;
  
  Gia_ManFraSetDefaultParams(&Pars);
  nFanMax = 0;
  Extra_UtilGetoptReset();
  bVar2 = false;
  bVar1 = false;
LAB_0024a891:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"FLsoibavh");
    iVar8 = globalUtilOptind;
    if (iVar3 == 0x46) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_0024a994:
        Abc_Print(-1,pcVar6);
        goto LAB_0024a99e;
      }
      Pars.nFrames = atoi(argv[globalUtilOptind]);
      uVar4 = Pars.nFrames;
    }
    else {
      if (iVar3 != 0x4c) {
        if (iVar3 == 0x61) {
          bVar2 = (bool)(bVar2 ^ 1);
        }
        else if (iVar3 == 0x62) {
          bVar1 = (bool)(bVar1 ^ 1);
        }
        else if (iVar3 == 0x69) {
          Pars.fInit = Pars.fInit ^ 1;
        }
        else if (iVar3 == 0x6f) {
          Pars.fOrPos = Pars.fOrPos ^ 1;
        }
        else if (iVar3 == 0x73) {
          Pars.fDisableSt = Pars.fDisableSt ^ 1;
        }
        else {
          if (iVar3 != 0x76) {
            if (iVar3 == -1) {
              pGVar5 = pAbc->pGia;
              if (pGVar5 != (Gia_Man_t *)0x0) {
                if (pGVar5->nRegs == 0) {
                  Abc_Print(-1,"The network is combinational.\n");
                  return 0;
                }
                if (bVar1) {
                  pGVar5 = Gia_ManFramesInitSpecial(pGVar5,Pars.nFrames,Pars.fVerbose);
                }
                else if (nFanMax == 0) {
                  if (bVar2) {
                    pGVar5 = Gia_ManFrames2(pGVar5,&Pars);
                  }
                  else {
                    pGVar5 = Gia_ManFrames(pGVar5,&Pars);
                  }
                }
                else {
                  pGVar5 = Gia_ManUnrollAndCofactor(pGVar5,Pars.nFrames,nFanMax,Pars.fVerbose);
                }
                Abc_FrameUpdateGia(pAbc,pGVar5);
                return 0;
              }
              pcVar6 = "Abc_CommandAbc9Frames(): There is no AIG.\n";
              iVar8 = -1;
              goto LAB_0024aab1;
            }
            goto LAB_0024a99e;
          }
          Pars.fVerbose = Pars.fVerbose ^ 1;
        }
        goto LAB_0024a891;
      }
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-L\" should be followed by an integer.\n";
        goto LAB_0024a994;
      }
      nFanMax = atoi(argv[globalUtilOptind]);
      uVar4 = nFanMax;
    }
    globalUtilOptind = iVar8 + 1;
    if ((int)uVar4 < 0) {
LAB_0024a99e:
      iVar8 = -2;
      Abc_Print(-2,"usage: &frames [-FL <num>] [-soibavh]\n");
      Abc_Print(-2,"\t         unrolls the design for several timeframes\n");
      Abc_Print(-2,"\t-F num : the number of frames to unroll [default = %d]\n",
                (ulong)(uint)Pars.nFrames);
      Abc_Print(-2,
                "\t-L num : the limit on fanout count of resets/enables to cofactor [default = %d]\n"
                ,(ulong)nFanMax);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (Pars.fDisableSt == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle disabling structural hashing [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (Pars.fOrPos == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-o     : toggle ORing corresponding POs [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (Pars.fInit == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-i     : toggle initializing registers [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle computing special AIG for BMC [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (!bVar2) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle using new algorithm [default = %s]\n",pcVar6);
      if (Pars.fVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar7);
      pcVar6 = "\t-h     : print the command usage\n";
LAB_0024aab1:
      Abc_Print(iVar8,pcVar6);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Frames( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManFrames2( Gia_Man_t * pAig, Gia_ParFra_t * pPars );

    Gia_Man_t * pTemp;
    Gia_ParFra_t Pars, * pPars = &Pars;
    int c;
    int nCofFanLit = 0;
    int fNewAlgo = 0;
    int fInitSpecial = 0;
    Gia_ManFraSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FLsoibavh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nCofFanLit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCofFanLit < 0 )
                goto usage;
            break;
        case 's':
            pPars->fDisableSt ^= 1;
            break;
        case 'o':
            pPars->fOrPos ^= 1;
            break;
        case 'i':
            pPars->fInit ^= 1;
            break;
        case 'b':
            fInitSpecial ^= 1;
            break;
        case 'a':
            fNewAlgo ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Frames(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( fInitSpecial )
        pTemp = Gia_ManFramesInitSpecial( pAbc->pGia, pPars->nFrames, pPars->fVerbose );
    else if ( nCofFanLit )
        pTemp = Gia_ManUnrollAndCofactor( pAbc->pGia, pPars->nFrames, nCofFanLit, pPars->fVerbose );
    else if ( fNewAlgo )
        pTemp = Gia_ManFrames2( pAbc->pGia, pPars );
    else
        pTemp = Gia_ManFrames( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &frames [-FL <num>] [-soibavh]\n" );
    Abc_Print( -2, "\t         unrolls the design for several timeframes\n" );
    Abc_Print( -2, "\t-F num : the number of frames to unroll [default = %d]\n", pPars->nFrames );
    Abc_Print( -2, "\t-L num : the limit on fanout count of resets/enables to cofactor [default = %d]\n", nCofFanLit );
    Abc_Print( -2, "\t-s     : toggle disabling structural hashing [default = %s]\n", pPars->fDisableSt? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle ORing corresponding POs [default = %s]\n", pPars->fOrPos? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggle initializing registers [default = %s]\n", pPars->fInit? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle computing special AIG for BMC [default = %s]\n", fInitSpecial? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle using new algorithm [default = %s]\n", fNewAlgo? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}